

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O1

void install_signal(int sig)

{
  int iVar1;
  sigaction sigact;
  sigaction sStack_a8;
  
  memcpy(&sStack_a8,&PTR_sighandler_00108d40,0x98);
  sigfillset(&sStack_a8.sa_mask);
  iVar1 = sigaction(sig,&sStack_a8,(sigaction *)0x0);
  if (-1 < iVar1) {
    return;
  }
  err(1,"sigaction for signal %i",sig);
}

Assistant:

static void install_signal(int sig)
{
	int ret;
	struct sigaction sigact = {
		.sa_sigaction = sighandler,
		.sa_flags = SA_SIGINFO,
	};

	sigfillset(&sigact.sa_mask);
	ret = sigaction(sig, &sigact, NULL);
	if (ret < 0)
		err(1, "sigaction for signal %i", sig);
}